

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator
          (ImmutableMessageLiteGenerator *this,Descriptor *descriptor,Context *context)

{
  ClassNameResolver *pCVar1;
  LogMessage *pLVar2;
  Descriptor *pDVar3;
  long lVar4;
  long lVar5;
  LogFinisher local_69;
  LogMessage local_68;
  
  MessageGenerator::MessageGenerator(&this->super_MessageGenerator,descriptor);
  (this->super_MessageGenerator)._vptr_MessageGenerator =
       (_func_int **)&PTR__ImmutableMessageLiteGenerator_004d19a0;
  this->context_ = context;
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
  FieldGeneratorMap(&this->field_generators_,descriptor,this->context_);
  if ((context->options_).enforce_lite == false) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_lite.cc"
               ,0x4a);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: !HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,
                        "Generator factory error: A lite message generator is used to generate non-lite messages."
                       );
    internal::LogFinisher::operator=(&local_69,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
  }
  pDVar3 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar3 + 4)) {
    lVar5 = 0x28;
    lVar4 = 0;
    do {
      local_68._0_8_ = *(long *)(*(long *)(pDVar3 + 0x28) + lVar5);
      if ((local_68._0_8_ != 0 && (*(byte *)(*(long *)(pDVar3 + 0x28) + -0x27 + lVar5) & 0x10) != 0)
         && ((*(int *)(local_68._0_8_ + 4) != 1 ||
             ((*(byte *)(*(long *)(local_68._0_8_ + 0x20) + 1) & 2) == 0)))) {
        std::
        _Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
        ::_M_insert_unique<google::protobuf::OneofDescriptor_const*>
                  ((_Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
                    *)&(this->super_MessageGenerator).oneofs_,(OneofDescriptor **)&local_68);
        pDVar3 = (this->super_MessageGenerator).descriptor_;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x48;
    } while (lVar4 < *(int *)(pDVar3 + 4));
  }
  return;
}

Assistant:

ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator(
    const Descriptor* descriptor, Context* context)
    : MessageGenerator(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(descriptor, context_) {
  GOOGLE_CHECK(!HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A lite message generator is used to "
         "generate non-lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      oneofs_.insert(descriptor_->field(i)->containing_oneof());
    }
  }
}